

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall
amrex::AmrLevel::AmrLevel
          (AmrLevel *this,Amr *papa,int lev,Geometry *level_geom,BoxArray *ba,
          DistributionMapping *dm,Real time)

{
  pointer pIVar1;
  FabFactory<amrex::FArrayBox> *pFVar2;
  pointer pSVar3;
  long lVar4;
  _Alloc_hider _Var5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  IndexSpace *pIVar9;
  StateDescriptor *d;
  long lVar10;
  BoxArray *this_00;
  initializer_list<int> __l;
  RegionTag statedata_index_new_tag;
  RegionTag statedata_index_tag;
  RegionTag statedata_tag;
  string local_170;
  unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  *local_150;
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *local_148;
  BoxArray *local_140;
  long local_138;
  Vector<int,_std::allocator<int>_> *local_130;
  long local_128;
  undefined1 local_120 [48];
  string local_f0;
  RegionTag level_tag;
  undefined3 uStack_cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_AmrLevel = (_func_int **)&PTR__AmrLevel_007d4b90;
  local_120._40_8_ = time;
  memcpy(&this->geom,level_geom,200);
  local_140 = &this->grids;
  BoxArray::BoxArray(local_140,ba);
  local_130 = (Vector<int,_std::allocator<int>_> *)dm;
  std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
             &this->dmap,
             (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)dm);
  local_148 = &this->state;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fine_ratio).vect[1] = 0;
  (this->fine_ratio).vect[2] = 0;
  (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
  super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->crse_ratio).vect[0] = 0;
  (this->crse_ratio).vect[1] = 0;
  *(undefined8 *)((this->crse_ratio).vect + 2) = 0;
  BoxArray::BoxArray(&this->m_AreaNotToTag);
  (this->m_AreaToTag).smallend.vect[0] = 1;
  (this->m_AreaToTag).smallend.vect[1] = 1;
  (this->m_AreaToTag).smallend.vect[2] = 1;
  (this->m_AreaToTag).bigend.vect[0] = 0;
  (this->m_AreaToTag).bigend.vect[1] = 0;
  *(undefined8 *)((this->m_AreaToTag).bigend.vect + 2) = 0;
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::FArrayBox> *)0x0;
  local_150 = &this->m_factory;
  this_00 = (BoxArray *)&this->field_0x220;
  lVar10 = 0;
  do {
    BoxArray::BoxArray(this_00);
    lVar10 = lVar10 + -0x68;
    this_00 = this_00 + 1;
  } while (lVar10 != -0x138);
  BoxArray::BoxArray(&this->nodal_grids);
  this->level = lev;
  this->parent = papa;
  this->levelDirectoryCreated = false;
  (this->fine_ratio).vect[0] = -1;
  (this->fine_ratio).vect[1] = -1;
  (this->fine_ratio).vect[2] = -1;
  (this->crse_ratio).vect[0] = -1;
  (this->crse_ratio).vect[1] = -1;
  (this->crse_ratio).vect[2] = -1;
  if (0 < lev) {
    pIVar1 = (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = pIVar1[(ulong)(uint)lev - 1].vect[2];
    *(undefined8 *)(this->crse_ratio).vect = *(undefined8 *)pIVar1[(ulong)(uint)lev - 1].vect;
    (this->crse_ratio).vect[2] = iVar8;
  }
  local_138 = (long)lev;
  if (lev < (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    pIVar1 = (papa->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = pIVar1[local_138].vect[2];
    *(undefined8 *)(this->fine_ratio).vect = *(undefined8 *)pIVar1[local_138].vect;
    (this->fine_ratio).vect[2] = iVar8;
  }
  iVar8 = DescriptorList::size((DescriptorList *)desc_lst);
  std::vector<amrex::StateData,_std::allocator<amrex::StateData>_>::resize
            (&local_148->super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>,
             (long)iVar8);
  pIVar9 = EB2::TopIndexSpaceIfPresent();
  if (pIVar9 == (IndexSpace *)0x0) {
    std::make_unique<amrex::DefaultFabFactory<amrex::FArrayBox>>();
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_170._M_dataplus._M_p = (pointer)0x0;
    pFVar2 = (local_150->_M_t).
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (local_150->_M_t).
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (FabFactory<amrex::FArrayBox> *)_Var5._M_p;
    if (pFVar2 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar2->_vptr_FabFactory[1])();
      if ((FabFactory<amrex::FArrayBox> *)local_170._M_dataplus._M_p !=
          (FabFactory<amrex::FArrayBox> *)0x0) {
        (*(*(_func_int ***)local_170._M_dataplus._M_p)[1])();
      }
    }
  }
  else {
    level_tag = (RegionTag)m_eb_basic_grow_cells._0_1_;
    uStack_cf = m_eb_basic_grow_cells._1_3_;
    __l._M_len = 3;
    __l._M_array = (iterator)&level_tag;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_170,__l,
               (allocator_type *)(local_120 + 0x30));
    makeEBFabFactory((Geometry *)local_120,(BoxArray *)&this->geom,(DistributionMapping *)ba,
                     local_130,(EBSupport)&local_170);
    uVar7 = local_120._0_8_;
    local_120._0_8_ = (long *)0x0;
    pFVar2 = (local_150->_M_t).
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (local_150->_M_t).
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (FabFactory<amrex::FArrayBox> *)uVar7;
    if (pFVar2 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar2->_vptr_FabFactory[1])();
      if ((long *)local_120._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_120._0_8_ + 8))();
      }
    }
    local_120._0_8_ = (FabFactory<amrex::FArrayBox> *)0x0;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
  }
  local_120._32_8_ = &(this->geom).domain;
  local_128 = 0;
  for (lVar10 = 0;
      lVar10 < ((long)(this->state).
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                     .super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0xe0; lVar10 = lVar10 + 1) {
    std::__cxx11::to_string(&local_170,lev);
    std::operator+(&local_50,"StateData_Level_",&local_170);
    FabArrayBase::RegionTag::RegionTag(&statedata_tag,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_170);
    iVar8 = (int)lVar10;
    std::__cxx11::to_string((string *)local_120,iVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&level_tag,
                   "StateData_",(string *)local_120);
    std::operator+(&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&level_tag,
                   "_Level_");
    std::__cxx11::to_string((string *)(local_120 + 0x30),lev);
    std::operator+(&local_70,&local_170,(string *)(local_120 + 0x30));
    FabArrayBase::RegionTag::RegionTag(&statedata_index_tag,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)(local_120 + 0x30));
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&level_tag);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::to_string((string *)local_120,iVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&level_tag,
                   "StateData_",(string *)local_120);
    std::operator+(&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&level_tag,
                   "_New_Level_");
    std::__cxx11::to_string((string *)(local_120 + 0x30),lev);
    std::operator+(&local_90,&local_170,(string *)(local_120 + 0x30));
    FabArrayBase::RegionTag::RegionTag(&statedata_index_new_tag,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)(local_120 + 0x30));
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&level_tag);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::to_string(&local_170,lev);
    std::operator+(&local_b0,"AmrLevel_Level_",&local_170);
    FabArrayBase::RegionTag::RegionTag(&level_tag,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_170);
    lVar6 = local_128;
    pSVar3 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = local_128 + -0x10;
    d = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar8);
    StateData::define((StateData *)((long)(pSVar3->domain).smallend.vect + lVar4),
                      (Box *)local_120._32_8_,local_140,(DistributionMapping *)local_130,d,
                      (Real)local_120._40_8_,
                      (this->parent->dt_level).super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_138],
                      (this->m_factory)._M_t.
                      super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                      _M_head_impl);
    FabArrayBase::RegionTag::~RegionTag(&level_tag);
    FabArrayBase::RegionTag::~RegionTag(&statedata_index_new_tag);
    FabArrayBase::RegionTag::~RegionTag(&statedata_index_tag);
    FabArrayBase::RegionTag::~RegionTag(&statedata_tag);
    local_128 = lVar6 + 0xe0;
  }
  if ((this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids != false) {
    constructAreaNotToTag(this);
  }
  this->post_step_regrid = 0;
  return;
}

Assistant:

AmrLevel::AmrLevel (Amr&            papa,
                    int             lev,
                    const Geometry& level_geom,
                    const BoxArray& ba,
                    const DistributionMapping& dm,
                    Real            time)
    :
    geom(level_geom),
    grids(ba),
    dmap(dm)
{
    BL_PROFILE("AmrLevel::AmrLevel(dm)");
    level  = lev;
    parent = &papa;
    levelDirectoryCreated = false;

    fine_ratio = IntVect::TheUnitVector(); fine_ratio.scale(-1);
    crse_ratio = IntVect::TheUnitVector(); crse_ratio.scale(-1);

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
    }
    if (level < parent->maxLevel())
    {
        fine_ratio = parent->refRatio(level);
    }

    state.resize(desc_lst.size());

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        m_factory = makeEBFabFactory(geom, ba, dm,
                                     {m_eb_basic_grow_cells,
                                      m_eb_volume_grow_cells,
                                      m_eb_full_grow_cells},
                                     m_eb_support_level);
    } else
#endif
    {
        m_factory = std::make_unique<FArrayBoxFactory>();
    }

    // Note that this creates a distribution map associated with grids.
    for (int i = 0; i < state.size(); i++)
    {
        MultiFab::RegionTag statedata_tag("StateData_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_tag("StateData_" + std::to_string(i) + "_Level_" + std::to_string(lev));
        MultiFab::RegionTag statedata_index_new_tag("StateData_" + std::to_string(i) + "_New_Level_" + std::to_string(lev));
        MultiFab::RegionTag level_tag("AmrLevel_Level_" + std::to_string(lev));
        state[i].define(geom.Domain(),
                        grids,
                        dm,
                        desc_lst[i],
                        time,
                        parent->dtLevel(lev),
                        *m_factory);
    }

    if (parent->useFixedCoarseGrids()) constructAreaNotToTag();

    post_step_regrid = 0;

    finishConstructor();
}